

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.h
# Opt level: O1

Transaction * __thiscall LinkedList<Transaction_*>::at(LinkedList<Transaction_*> *this,int index)

{
  ostream *poVar1;
  int iVar2;
  
  if ((-1 < index) && (index < this->size)) {
    iVar2 = index + 1;
    do {
      this = (LinkedList<Transaction_*> *)this->head;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    return *(Transaction **)this;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Index out of range");
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(1);
}

Assistant:

T LinkedList<T>::at(int index)
{
    auto currNode = this->head;

    if(index >= size || index < 0)
    {
        std::cout << "Index out of range" << std::endl;
        exit(1);
    }
    else {
        for (int i = 0; i < index; i++) {
            currNode = currNode->next;
        }
        return currNode->data;
    }
}